

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_asformat.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::number::impl::LocalizedNumberFormatterAsFormat::format
          (LocalizedNumberFormatterAsFormat *this,Formattable *obj,UnicodeString *appendTo,
          FieldPosition *pos,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t iVar3;
  UnicodeString local_1e8;
  undefined1 local_1a1;
  undefined4 local_1a0;
  bool found;
  undefined1 local_190 [8];
  UFormattedNumberData data;
  UErrorCode *status_local;
  FieldPosition *pos_local;
  UnicodeString *appendTo_local;
  Formattable *obj_local;
  LocalizedNumberFormatterAsFormat *this_local;
  
  data.string._248_8_ = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    UFormattedNumberData::UFormattedNumberData((UFormattedNumberData *)local_190);
    Formattable::populateDecimalQuantity
              (obj,(DecimalQuantity *)&data,(UErrorCode *)data.string._248_8_);
    UVar1 = ::U_FAILURE(*(UErrorCode *)data.string._248_8_);
    if (UVar1 == '\0') {
      LocalizedNumberFormatter::formatImpl
                (&this->fFormatter,(UFormattedNumberData *)local_190,
                 (UErrorCode *)data.string._248_8_);
      UVar1 = ::U_FAILURE(*(UErrorCode *)data.string._248_8_);
      if (UVar1 == '\0') {
        FieldPosition::setBeginIndex(pos,0);
        FieldPosition::setEndIndex(pos,0);
        local_1a1 = NumberStringBuilder::nextFieldPosition
                              ((NumberStringBuilder *)&data.quantity.usingBytes,pos,
                               (UErrorCode *)data.string._248_8_);
        if (((bool)local_1a1) && (iVar2 = UnicodeString::length(appendTo), iVar2 != 0)) {
          iVar2 = FieldPosition::getBeginIndex(pos);
          iVar3 = UnicodeString::length(appendTo);
          FieldPosition::setBeginIndex(pos,iVar2 + iVar3);
          iVar2 = FieldPosition::getEndIndex(pos);
          iVar3 = UnicodeString::length(appendTo);
          FieldPosition::setEndIndex(pos,iVar2 + iVar3);
        }
        NumberStringBuilder::toTempUnicodeString
                  (&local_1e8,(NumberStringBuilder *)&data.quantity.usingBytes);
        UnicodeString::append(appendTo,&local_1e8);
        UnicodeString::~UnicodeString(&local_1e8);
      }
    }
    local_1a0 = 1;
    UFormattedNumberData::~UFormattedNumberData((UFormattedNumberData *)local_190);
  }
  return appendTo;
}

Assistant:

UnicodeString& LocalizedNumberFormatterAsFormat::format(const Formattable& obj, UnicodeString& appendTo,
                                                        FieldPosition& pos, UErrorCode& status) const {
    if (U_FAILURE(status)) { return appendTo; }
    UFormattedNumberData data;
    obj.populateDecimalQuantity(data.quantity, status);
    if (U_FAILURE(status)) {
        return appendTo;
    }
    fFormatter.formatImpl(&data, status);
    if (U_FAILURE(status)) {
        return appendTo;
    }
    // always return first occurrence:
    pos.setBeginIndex(0);
    pos.setEndIndex(0);
    bool found = data.string.nextFieldPosition(pos, status);
    if (found && appendTo.length() != 0) {
        pos.setBeginIndex(pos.getBeginIndex() + appendTo.length());
        pos.setEndIndex(pos.getEndIndex() + appendTo.length());
    }
    appendTo.append(data.string.toTempUnicodeString());
    return appendTo;
}